

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void glist_readatoms(_glist *x,int natoms,t_atom *vec,int *p_nextmsg,t_symbol *templatesym,t_word *w
                    ,int argc,t_atom *argv)

{
  int iVar1;
  int iVar2;
  _array *x_00;
  t_symbol *s;
  _binbuf *x_01;
  int iVar3;
  t_template *template;
  t_template *ptVar4;
  _binbuf *x_02;
  long lVar5;
  t_atom *argv_00;
  long lVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  undefined4 in_register_00000034;
  long lVar10;
  long lVar11;
  t_atomtype tVar12;
  int iVar13;
  t_atomtype tVar14;
  uint uVar15;
  long lVar16;
  t_atomtype tVar17;
  undefined4 in_stack_0000000c;
  t_atom *in_stack_ffffffffffffff70;
  
  lVar10 = CONCAT44(in_register_00000034,natoms);
  tVar12 = (t_atomtype)x;
  template = template_findbyname((t_symbol *)p_nextmsg);
  if (template == (t_template *)0x0) {
    pd_error((void *)0x0,"%s: no such template",*(undefined8 *)p_nextmsg);
    vec->a_type = tVar12;
  }
  else {
    word_restore((t_word *)templatesym,template,(int)w,(t_atom *)CONCAT44(in_stack_0000000c,argc));
    iVar1 = template->t_n;
    if (0 < (long)iVar1) {
      lVar6 = (long)(int)tVar12;
      lVar16 = 0;
      do {
        iVar3 = template->t_vec[lVar16].ds_type;
        if (iVar3 == 2) {
          x_02 = binbuf_new();
          tVar17 = vec->a_type;
          lVar11 = (long)(int)tVar17;
          bVar8 = (int)tVar17 < (int)tVar12;
          tVar14 = tVar17;
          if (((int)tVar17 < (int)tVar12) && (*(int *)(lVar10 + lVar11 * 0x10) != 4)) {
            piVar7 = (int *)(lVar11 * 0x10 + lVar10 + 0x10);
            lVar5 = 0;
            do {
              if ((1 - lVar6) + lVar11 == lVar5) {
                bVar8 = (lVar11 - lVar5) + 1 < lVar6;
                tVar14 = tVar12;
                goto LAB_00151982;
              }
              lVar5 = lVar5 + -1;
              iVar3 = *piVar7;
              piVar7 = piVar7 + 4;
            } while (iVar3 != 4);
            bVar8 = lVar11 - lVar5 < lVar6;
            tVar14 = tVar17 - (int)lVar5;
          }
LAB_00151982:
          binbuf_restore(x_02,tVar14 - tVar17,(t_atom *)(lVar11 * 0x10 + lVar10));
          x_01 = (_binbuf *)(&templatesym->s_name)[lVar16];
          iVar3 = binbuf_getnatom(x_02);
          argv_00 = binbuf_getvec(x_02);
          binbuf_add(x_01,iVar3,argv_00);
          binbuf_free(x_02);
          tVar17 = tVar14 + A_FLOAT;
          if (!bVar8) {
            tVar17 = tVar12;
          }
          vec->a_type = tVar17;
        }
        else if (iVar3 == 3) {
          x_00 = (_array *)(&templatesym->s_name)[lVar16];
          iVar3 = x_00->a_elemsize;
          s = template->t_vec[lVar16].ds_arraytemplate;
          ptVar4 = template_findbyname(s);
          if (ptVar4 != (t_template *)0x0) {
            iVar9 = 0;
            do {
              tVar17 = vec->a_type;
              lVar11 = (long)(int)tVar17;
              uVar15 = 0;
              if ((int)tVar17 < (int)tVar12) {
                bVar8 = true;
                tVar14 = tVar17;
                if (*(int *)(lVar10 + lVar11 * 0x10) != 4) {
                  iVar13 = -tVar17;
                  piVar7 = (int *)(lVar11 * 0x10 + lVar10 + 0x10);
                  do {
                    if (iVar13 + tVar12 == 1) {
                      bVar8 = lVar11 + 1 < lVar6;
                      tVar14 = tVar12;
                      goto LAB_00151895;
                    }
                    iVar13 = iVar13 + -1;
                    lVar11 = lVar11 + 1;
                    iVar2 = *piVar7;
                    piVar7 = piVar7 + 4;
                  } while (iVar2 != 4);
                  bVar8 = lVar11 < lVar6;
                  tVar14 = -iVar13;
                }
LAB_00151895:
                vec->a_type = bVar8 + tVar14;
                uVar15 = tVar14 - tVar17;
              }
              if (uVar15 == 0) goto LAB_001519dc;
              array_resize(x_00,iVar9 + 1);
              glist_readatoms((_glist *)((ulong)x & 0xffffffff),natoms,vec,(int *)s,
                              (t_symbol *)(x_00->a_vec + (long)iVar9 * (long)iVar3),
                              (t_word *)(ulong)uVar15,tVar17 * 0x10 + natoms,
                              in_stack_ffffffffffffff70);
              iVar9 = iVar9 + 1;
            } while( true );
          }
          pd_error((void *)0x0,"%s: no such template",s->s_name);
        }
LAB_001519dc:
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar1);
    }
  }
  return;
}

Assistant:

static void glist_readatoms(t_glist *x, int natoms, t_atom *vec,
    int *p_nextmsg, t_symbol *templatesym, t_word *w, int argc, t_atom *argv)
{
    int message, n, i;

    t_template *template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "%s: no such template", templatesym->s_name);
        *p_nextmsg = natoms;
        return;
    }
    word_restore(w, template, argc, argv);
    n = template->t_n;
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = 0;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            t_template *arraytemplate =
                template_findbyname(arraytemplatesym);
            if (!arraytemplate)
            {
                pd_error(0, "%s: no such template", arraytemplatesym->s_name);
            }
            else while (1)
            {
                t_word *element;
                int nline = canvas_scanbinbuf(natoms, vec, &message, p_nextmsg);
                    /* empty line terminates array */
                if (!nline)
                    break;
                array_resize(a, nitems + 1);
                element = (t_word *)(((char *)a->a_vec) +
                    nitems * elemsize);
                glist_readatoms(x, natoms, vec, p_nextmsg, arraytemplatesym,
                    element, nline, vec + message);
                nitems++;
            }
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
        {
            t_binbuf *z = binbuf_new();
            int first = *p_nextmsg, last;
            for (last = first; last < natoms && vec[last].a_type != A_SEMI;
                last++);
            binbuf_restore(z, last-first, vec+first);
            binbuf_add(w[i].w_binbuf, binbuf_getnatom(z), binbuf_getvec(z));
            binbuf_free(z);
            last++;
            if (last > natoms) last = natoms;
            *p_nextmsg = last;
        }
    }
}